

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::experience_replay(memory_tree *b,single_learner *base)

{
  uint32_t local_40;
  uint32_t cn;
  v_array<unsigned_int> tmp_path;
  
  cn = 0;
  local_40 = random_sample_example_pop(b,&cn);
  if (-1 < (int)local_40) {
    if ((b->current_pass == 0) || (b->dream_at_update != 0)) {
      tmp_path._begin = (uint *)CONCAT44(tmp_path._begin._4_4_,local_40);
      insert_example(b,base,(uint32_t *)&tmp_path,false);
    }
    else {
      tmp_path.end_array = (uint *)0x0;
      tmp_path.erase_count = 0;
      tmp_path._begin = (uint *)0x0;
      tmp_path._end = (uint *)0x0;
      route_to_leaf(b,base,&local_40,0,&tmp_path,true);
      v_array<unsigned_int>::delete_v(&tmp_path);
    }
  }
  return;
}

Assistant:

void experience_replay(memory_tree& b, single_learner& base)
    {
        uint32_t cn = 0; //start from root, randomly descent down! 
	    int ec_id = random_sample_example_pop(b,cn);
	    if (ec_id >= 0){
            if (b.current_pass < 1)
            	insert_example(b, base, ec_id); //unsupervised learning
            else{
		if (b.dream_at_update == false){
	        	v_array<uint32_t> tmp_path = v_init<uint32_t>();
			route_to_leaf(b, base, ec_id, 0, tmp_path, true);
			tmp_path.delete_v();
		}
		else{
                	insert_example(b, base, ec_id);
		}
            }
        }
    }